

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void __thiscall
bpwriter::format_int(bpwriter *this,char *p,size_t len,char *type_prefix,fmtopts *opts,int flags)

{
  char cVar1;
  wchar_t wVar2;
  fmtopts *pfVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  CVmObjString *this_00;
  int iVar10;
  int i;
  int iVar11;
  ulong uVar12;
  int iVar13;
  char local_5a;
  char local_59;
  char local_58;
  char local_57;
  char local_56;
  char local_55;
  undefined4 local_54;
  fmtopts *local_50;
  char *local_48;
  uint local_3c;
  char *local_38;
  
  uVar9 = 1;
  if (len != 0 && p != (char *)0x0) {
    uVar9 = len;
  }
  local_48 = "0";
  if (len != 0 && p != (char *)0x0) {
    local_48 = p;
  }
  uVar8 = 0;
  do {
    if (*local_48 != '0') {
      local_54 = 0;
      goto LAB_0022fdae;
    }
    uVar8 = uVar8 + 1;
  } while (uVar9 + (uVar9 == 0) != uVar8);
  local_54 = (undefined4)CONCAT71((int7)((ulong)opts >> 8),uVar9 <= uVar8);
LAB_0022fdae:
  cVar1 = *local_48;
  iVar13 = (uint)(opts->sign != '\0' && cVar1 != '-') + (int)uVar9;
  if (opts->group != L'\0') {
    iVar13 = iVar13 + (int)((~(ulong)(cVar1 == '-') + uVar9) / 3);
  }
  iVar11 = (int)uVar9 - (uint)(cVar1 == '-');
  local_3c = flags;
  local_38 = type_prefix;
  if ((type_prefix != (char *)0x0 && (char)local_54 == '\0') && opts->pound != 0) {
    sVar5 = strlen(type_prefix);
    iVar13 = iVar13 + (int)sVar5;
  }
  iVar4 = opts->prec - iVar11;
  if (iVar4 == 0 || opts->prec < iVar11) {
    iVar4 = 0;
  }
  iVar10 = opts->width - (iVar4 + iVar13);
  if (iVar10 == 0 || opts->width < iVar4 + iVar13) {
    iVar10 = 0;
  }
  local_50 = opts;
  if ((opts->left_align == 0) && (iVar10 != 0)) {
    wVar2 = opts->pad;
    iVar13 = iVar10;
    do {
      pcVar6 = CVmObjString::cons_append(this->str,this->dst,wVar2,0x40);
      this->dst = pcVar6;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  pcVar6 = local_48;
  pfVar3 = local_50;
  if ((local_50->sign != '\0') && (*local_48 != '-')) {
    local_56 = local_50->sign;
    pcVar7 = CVmObjString::cons_append(this->str,this->dst,&local_56,1,0x40);
    this->dst = pcVar7;
  }
  cVar1 = *pcVar6;
  if (cVar1 == '-') {
    pcVar6 = pcVar6 + 1;
    local_55 = cVar1;
    pcVar7 = CVmObjString::cons_append(this->str,this->dst,&local_55,1,0x40);
    this->dst = pcVar7;
    uVar9 = uVar9 - 1;
  }
  pcVar7 = local_38;
  local_48 = pcVar6;
  if (((char)local_54 == '\0' && local_38 != (char *)0x0) && pfVar3->pound != 0) {
    sVar5 = strlen(local_38);
    pcVar6 = CVmObjString::cons_append(this->str,this->dst,pcVar7,sVar5,0x40);
    this->dst = pcVar6;
  }
  if (iVar11 < pfVar3->prec) {
    do {
      local_5a = '0';
      pcVar6 = CVmObjString::cons_append(this->str,this->dst,&local_5a,1,0x40);
      this->dst = pcVar6;
      iVar11 = iVar11 + 1;
    } while (iVar11 < pfVar3->prec);
  }
  if (uVar9 != 0) {
    uVar12 = 0;
    uVar8 = uVar9;
    do {
      if (((uVar9 + (uVar8 / 3) * -3 == uVar12) && (local_50->group != L'\0')) && ((int)uVar12 != 0)
         ) {
        pcVar6 = CVmObjString::cons_append(this->str,this->dst,local_50->group,0x40);
        this->dst = pcVar6;
      }
      iVar13 = (int)local_48[uVar12];
      if (iVar13 - 0x3aU < 0xfffffff6) {
        if ((local_3c & 2) == 0) {
          iVar13 = tolower(iVar13);
          local_57 = (char)iVar13;
          this_00 = this->str;
          pcVar6 = this->dst;
          pcVar7 = &local_57;
        }
        else {
          iVar13 = toupper(iVar13);
          local_58 = (char)iVar13;
          this_00 = this->str;
          pcVar6 = this->dst;
          pcVar7 = &local_58;
        }
      }
      else {
        this_00 = this->str;
        pcVar6 = this->dst;
        pcVar7 = &local_59;
        local_59 = local_48[uVar12];
      }
      pcVar6 = CVmObjString::cons_append(this_00,pcVar6,pcVar7,1,0x40);
      this->dst = pcVar6;
      uVar8 = uVar8 - 1;
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  if ((local_50->left_align != 0) && (iVar10 != 0)) {
    wVar2 = local_50->pad;
    do {
      pcVar6 = CVmObjString::cons_append(this->str,this->dst,wVar2,0x40);
      this->dst = pcVar6;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  return;
}

Assistant:

void format_int(VMG_ const char *p, size_t len,
                    const char *type_prefix,
                    const fmtopts &opts, int flags)
    {
        /* if they're trying to pawn off an empty string on us, use "0" */
        if (p == 0 || len == 0)
            p = "0", len = 1;

        /* note if the value is all zeros */
        int zero = TRUE;
        const char *p2 = p;
        for (size_t i = 0 ; i < len ; ++i)
        {
            if (*p2 != '0')
            {
                zero = FALSE;
                break;
            }
        }

        /* 
         *   get the number of digits: assume that the whole thing is digits
         *   except for a leading minus sign 
         */
        int digits = len;
        if (*p == '-')
            --digits;

        /* 
         *   Figure the display width required.  Start with the length of the
         *   string.  If we the "sign" option is set and we don't have a "-"
         *   sign, add space for a "+" sign.  If the "group" option is set,
         *   add a comma for each group of three digits.  If the '#' flag is
         *   set, add the type prefix if the value is nonzero.  
         */
        int dispwid = len;
        if (opts.sign != '\0' && *p != '-')
            dispwid += 1;
        if (opts.group != 0)
            dispwid += ((len - (*p == '-' ? 1 : 0)) - 1)/3;
        if (opts.pound && type_prefix != 0 && !zero)
            dispwid += strlen(type_prefix);

        /*
         *   If there's a precision setting, it means that we're to add
         *   leading zeros to bring the number of digits up to the
         *   precision. 
         */
        if (digits < opts.prec)
            dispwid += opts.prec - digits;

        /* 
         *   Figure the amount of padding.  If there's an explicit width spec
         *   in the options, and the display width is less than the width
         *   spec, pad by the differene.  
         */
        int padcnt = (opts.width > dispwid ? opts.width - dispwid : 0);

        /* if they want right alignment, add padding characters before */
        if (!opts.left_align)
            putwch(opts.pad, padcnt);

        /* add the + sign if needed */
        if (opts.sign && *p != '-')
            putch(opts.sign);

        /* if there's a '-' sign, write it */
        if (*p == '-')
            putch(*p++), --len;

        /* add the type prefix */
        if (opts.pound && type_prefix != 0 && !zero)
            puts(type_prefix);

        /* add the leading zeros for the precision */
        for (int i = digits ; i < opts.prec ; ++i)
            putch('0');

        /* write the digits, adding grouping commas and converting case */
        for (int dig = 0 ; len != 0 ; ++p, --len, ++dig)
        {
            /* 
             *   if this isn't the first digit, and we have a multiple of
             *   three digits remaining, and we're using grouping, add the
             *   group comma 
             */
            if (opts.group != 0 && dig != 0 && len % 3 == 0)
                putwch(opts.group);

            /* write this character, converting case as needed */
            if (is_digit(*p))
                putch(*p);
            else if ((flags & FI_CAPS) != 0)
                putch((char)toupper(*p));
            else
                putch((char)tolower(*p));
        }

        /* if they want left alignment, add padding characters after */
        if (opts.left_align)
            putwch(opts.pad, padcnt);
    }